

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linf.c
# Opt level: O0

int linfget(lindef *lin)

{
  long lVar1;
  size_t sVar2;
  long in_RDI;
  bool bVar3;
  int nl_len;
  size_t rdlen;
  char *p;
  int local_24;
  size_t local_20;
  byte *local_18;
  int local_4;
  
  lVar1 = ftell(*(FILE **)(in_RDI + 0xd0));
  *(long *)(in_RDI + 0x150) = lVar1;
  if (*(int *)(in_RDI + 0x140) == 0) {
    local_20 = fread((void *)(in_RDI + 0xd8),1,0x62,*(FILE **)(in_RDI + 0xd0));
  }
  else {
    memmove((void *)(in_RDI + 0xd8),(void *)(in_RDI + 0xd8 + (long)*(int *)(in_RDI + 0x13c)),
            (long)*(int *)(in_RDI + 0x140));
    *(long *)(in_RDI + 0x150) = *(long *)(in_RDI + 0x150) - (long)*(int *)(in_RDI + 0x140);
    local_20 = fread((void *)(in_RDI + 0xd8 + (long)*(int *)(in_RDI + 0x140)),1,
                     0x62 - (long)*(int *)(in_RDI + 0x140),*(FILE **)(in_RDI + 0xd0));
    local_20 = (long)*(int *)(in_RDI + 0x140) + local_20;
  }
  if (local_20 == 0) {
    local_4 = 1;
  }
  else {
    if ((*(ushort *)(in_RDI + 200) & 2) == 0) {
      *(long *)(in_RDI + 0x148) = *(long *)(in_RDI + 0x148) + 1;
    }
    *(undefined1 *)(in_RDI + 0xd8 + local_20) = 0;
    for (local_18 = (byte *)(in_RDI + 0xd8 + (long)*(int *)(in_RDI + 0x140)); *local_18 != 0;
        local_18 = local_18 + 1) {
      *local_18 = G_cmap_input[*local_18];
    }
    local_18 = (byte *)(in_RDI + 0xd8);
    while( true ) {
      bVar3 = false;
      if ((*local_18 != '\n') && (bVar3 = false, *local_18 != '\r')) {
        bVar3 = *local_18 != '\0';
      }
      if (!bVar3) break;
      local_18 = local_18 + 1;
    }
    if (((*local_18 != '\0') && (local_18 + 1 == (byte *)(in_RDI + 0x13a))) &&
       (sVar2 = fread(local_18 + 1,1,1,*(FILE **)(in_RDI + 0xd0)), sVar2 == 1)) {
      local_20 = local_20 + 1;
      local_18[2] = '\0';
    }
    if (*local_18 == '\0') {
      *(ushort *)(in_RDI + 200) = *(ushort *)(in_RDI + 200) | 2;
      *(short *)(in_RDI + 0xca) = (short)local_20;
      *(undefined4 *)(in_RDI + 0x140) = 0;
    }
    else {
      if (((*local_18 == '\n') && (local_18[1] == '\r')) ||
         ((*local_18 == '\r' && (local_18[1] == '\n')))) {
        local_24 = 2;
      }
      else {
        local_24 = 1;
      }
      *(ushort *)(in_RDI + 200) = *(ushort *)(in_RDI + 200) & 0xfffd;
      *(short *)(in_RDI + 0xca) = (short)local_18 - ((short)in_RDI + 0xd8);
      *local_18 = '\0';
      *(int *)(in_RDI + 0x13c) = ((int)local_18 + local_24) - ((int)in_RDI + 0xd8);
      *(int *)(in_RDI + 0x140) = (int)local_20 - *(int *)(in_RDI + 0x13c);
    }
    *(long *)(in_RDI + 0xc0) = in_RDI + 0xd8;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int linfget(lindef *lin)
{
#   define  linf ((linfdef *)lin)
    char   *p;
    size_t  rdlen;
    int     nl_len;

    /* remember seek position of start of current line */
    linf->linfseek = osfpos(linf->linffp);

    /*
     *   if we have data left in the buffer after the end of this line,
     *   move it to the start of the buffer
     */
    if (linf->linfnxtlen != 0)
    {
        /* move the data down */
        memmove(linf->linfbuf, linf->linfbuf + linf->linfbufnxt,
                linf->linfnxtlen);

        /* 
         *   adjust the seek position to account for the fact that we've
         *   read ahead in the file 
         */
        linf->linfseek -= linf->linfnxtlen;

        /* 
         *   Fill up the rest of the buffer.  Leave one byte for a null
         *   terminator and one byte for a possible extra newline pair
         *   character (see below), hence fill to sizeof(buf)-2.  
         */
        rdlen = osfrbc(linf->linffp, linf->linfbuf + linf->linfnxtlen,
                       sizeof(linf->linfbuf) - linf->linfnxtlen - 2);

        /* 
         *   the total space is the amount we had left over plus the
         *   amount we just read 
         */
        rdlen += linf->linfnxtlen;
    }
    else
    {
        /* 
         *   We have nothing in the buffer - fill it up.  Fill to
         *   sizeof(buf)-2 to leave room for a null terminator plus a
         *   possible extra newline pair character (see below). 
         */
        rdlen = osfrbc(linf->linffp, linf->linfbuf,
                       sizeof(linf->linfbuf) - 2);
    }

    /* 
     *   if there's nothing in the buffer at this point, we've reached the
     *   end of the file 
     */
    if (rdlen == 0)
        return TRUE;

    /* 
     *   if the last line was not a continuation line, increment the line
     *   counter for the start of a new line 
     */
    if (!(lin->linflg & LINFMORE))
        ++(linf->linfnum);

    /* null-terminate the buffer contents */
    linf->linfbuf[rdlen] = '\0';

    /* perform character mapping on th new part only */
    for (p = linf->linfbuf + linf->linfnxtlen ; *p != '\0' ; ++p)
        *p = cmap_n2i(*p);

    /* 
     *   scan the for the first newline in the buffer, allowing newline
     *   conventions that involve either CR or LF 
     */
    for (p = linf->linfbuf ; *p != '\n' && *p != '\r' && *p != '\0' ; ++p) ;

    /*
     *   Check to see if this character is followed by its newline pair
     *   complement, to allow for either CR-LF or LF-CR sequences, as well
     *   as plain single-byte newline (CR or LF) sequences.
     *   
     *   First, though, one weird special case: if this character is at
     *   the read limit in the buffer, the complementary character might
     *   be lurking in the next byte that we haven't read.  In this case,
     *   use that one-byte reserve we have left (we filled the buffer only
     *   to length-2 so far) and read the next byte.  
     */
    if (*p != '\0' && p + 1 == linf->linfbuf + sizeof(linf->linfbuf) - 2)
    {
        /* 
         *   we've filled the buffer to but not including the reserve for
         *   just this case - fetch the extra character 
         */
        if (osfrbc(linf->linffp, p + 1, 1) == 1)
        {
            /* increase the total read length for the extra byte */
            ++rdlen;
            *(p+2) = '\0';
        }
    }

    /* 
     *   now we can check for the newline type, since we have definitely
     *   read the full paired sequence 
     */
    if (*p == '\0')
    {
        /* there's no newline in the buffer - we'll return a partial line */
        nl_len = 0;

        /* set the partial line flag */
        lin->linflg |= LINFMORE;

        /* return the entire buffer */
        lin->linlen = rdlen;

        /* there's nothing left for the next time through */
        linf->linfnxtlen = 0;
    }
    else
    {
        /* check for a complementary pair */
        if ((*p == '\n' && *(p+1) == '\r') || (*p == '\r' && *(p+1) == '\n'))
        {
            /* we have a paired newline */
            nl_len = 2;
        }
        else
        {
            /* we have but a single-character newline sequence */
            nl_len = 1;
        }

        /* this is the end of a line */
        lin->linflg &= ~LINFMORE;

        /* 
         *   return only the part of the buffer up to, but not including,
         *   the newline 
         */
        lin->linlen = (p - linf->linfbuf);

        /* null-terminate the buffer at the newline */
        *p = '\0';

        /* 
         *   anything remaining after the newline sequence is available
         *   for reading the next time through 
         */
        linf->linfbufnxt = ((p + nl_len) - linf->linfbuf);
        linf->linfnxtlen = rdlen - linf->linfbufnxt;
    }

    /* make sure buffer pointer is correct */
    lin->linbuf = linf->linfbuf;

    LINFDEBUG(printf("%s\n", linf->linfbuf));

    /* success */
    return FALSE;

#   undef  linf
}